

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall
wallet::CWallet::SetAddressBookWithDB
          (CWallet *this,WalletBatch *batch,CTxDestination *address,string *strName,
          optional<wallet::AddressPurpose> *new_purpose)

{
  long lVar1;
  ConstevalFormatString<0U> wallet_fmt;
  ConstevalFormatString<0U> wallet_fmt_00;
  bool bVar2;
  pointer ppVar3;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *args;
  signal<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::signals2::mutex>
  *in_RDX;
  CWallet *in_RSI;
  long in_RDI;
  _Optional_payload_base<wallet::AddressPurpose> *in_R8;
  long in_FS_OFFSET;
  string *encoded_dest;
  CAddressBookData *record;
  bool is_mine;
  bool fUpdated;
  iterator mi;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock51;
  optional<wallet::AddressPurpose> purpose;
  undefined4 in_stack_fffffffffffffe68;
  ChangeType in_stack_fffffffffffffe6c;
  AddressPurpose in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined1 args_2;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  string *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  undefined4 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea4;
  undefined1 in_stack_fffffffffffffea5;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  CWallet *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  byte local_145;
  mapped_type *local_130;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  byte bVar4;
  bool local_9d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::optional<wallet::AddressPurpose>::optional
            ((optional<wallet::AddressPurpose> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffea8,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffea7,
                      CONCAT16(in_stack_fffffffffffffea6,
                               CONCAT15(in_stack_fffffffffffffea5,
                                        CONCAT14(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                )))),
             (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
             (char *)in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
  std::
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
  ::find((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
          *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
         (key_type *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  std::
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
  ::end((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
         *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  bVar2 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                          (_Self *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  bVar4 = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_iterator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>
                  *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    in_stack_fffffffffffffede =
         CAddressBookData::IsChange
                   ((CAddressBookData *)
                    CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    bVar4 = in_stack_fffffffffffffede ^ 0xff;
  }
  std::
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
  ::end((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
         *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  bVar2 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                          (_Self *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  args_2 = (undefined1)((uint)in_stack_fffffffffffffe74 >> 0x18);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    local_130 = std::
                map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
                ::operator[]((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
                              *)in_stack_fffffffffffffe90,(key_type *)in_stack_fffffffffffffe88);
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>
                           *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_130 = &ppVar3->second;
  }
  std::__cxx11::string::string
            (in_stack_fffffffffffffeb0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea8);
  CAddressBookData::SetLabel
            ((CAddressBookData *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (string *)0x1b1184);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  IsMine((CWallet *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
         (CTxDestination *)in_stack_fffffffffffffe90);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<wallet::AddressPurpose> *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  if (bVar2) {
    (local_130->purpose).super__Optional_base<wallet::AddressPurpose,_true,_true>._M_payload.
    super__Optional_payload_base<wallet::AddressPurpose> = *in_R8;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  EncodeDestination_abi_cxx11_
            ((CTxDestination *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<wallet::AddressPurpose> *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_145 = 0;
  if (bVar2) {
    std::optional<wallet::AddressPurpose>::operator*
              ((optional<wallet::AddressPurpose> *)
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    PurposeToString_abi_cxx11_((AddressPurpose)((ulong)in_RSI >> 0x20));
    bVar2 = WalletBatch::WritePurpose
                      ((WalletBatch *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                       in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    local_145 = bVar2 ^ 0xff;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    in_stack_fffffffffffffea8 = in_RSI;
  }
  if ((local_145 & 1) == 0) {
    bVar2 = WalletBatch::WriteName
                      ((WalletBatch *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                       in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    if (bVar2) {
      args = (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)(in_RDI + 0x418);
      std::optional<wallet::AddressPurpose>::value_or<wallet::AddressPurpose>
                ((optional<wallet::AddressPurpose> *)args,
                 (AddressPurpose *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      boost::signals2::
      signal<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::signals2::mutex>
      ::operator()(in_RDX,args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),(bool)args_2,
                   in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      local_9d = true;
    }
    else {
      wallet_fmt_00.fmt._6_1_ = in_stack_fffffffffffffede;
      wallet_fmt_00.fmt._0_6_ = in_stack_fffffffffffffed8;
      wallet_fmt_00.fmt._7_1_ = bVar4;
      WalletLogPrintf<>(in_stack_fffffffffffffea8,wallet_fmt_00);
      local_9d = false;
    }
  }
  else {
    wallet_fmt.fmt._6_1_ = in_stack_fffffffffffffede;
    wallet_fmt.fmt._0_6_ = in_stack_fffffffffffffed8;
    wallet_fmt.fmt._7_1_ = bVar4;
    WalletLogPrintf<>(in_stack_fffffffffffffea8,wallet_fmt);
    local_9d = false;
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9d;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::SetAddressBookWithDB(WalletBatch& batch, const CTxDestination& address, const std::string& strName, const std::optional<AddressPurpose>& new_purpose)
{
    bool fUpdated = false;
    bool is_mine;
    std::optional<AddressPurpose> purpose;
    {
        LOCK(cs_wallet);
        std::map<CTxDestination, CAddressBookData>::iterator mi = m_address_book.find(address);
        fUpdated = mi != m_address_book.end() && !mi->second.IsChange();

        CAddressBookData& record = mi != m_address_book.end() ? mi->second : m_address_book[address];
        record.SetLabel(strName);
        is_mine = IsMine(address) != ISMINE_NO;
        if (new_purpose) { /* update purpose only if requested */
            record.purpose = new_purpose;
        }
        purpose = record.purpose;
    }

    const std::string& encoded_dest = EncodeDestination(address);
    if (new_purpose && !batch.WritePurpose(encoded_dest, PurposeToString(*new_purpose))) {
        WalletLogPrintf("Error: fail to write address book 'purpose' entry\n");
        return false;
    }
    if (!batch.WriteName(encoded_dest, strName)) {
        WalletLogPrintf("Error: fail to write address book 'name' entry\n");
        return false;
    }

    // In very old wallets, address purpose may not be recorded so we derive it from IsMine
    NotifyAddressBookChanged(address, strName, is_mine,
                             purpose.value_or(is_mine ? AddressPurpose::RECEIVE : AddressPurpose::SEND),
                             (fUpdated ? CT_UPDATED : CT_NEW));
    return true;
}